

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

type * __thiscall
duckdb::Deserializer::
Read<std::priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar2;
  pair<double,_unsigned_long> local_40;
  
  (__return_storage_ptr__->c).
  super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->c).
  super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->c).
  super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*this->_vptr_Deserializer[8])(this);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 != 0) {
    do {
      (*this->_vptr_Deserializer[6])(this);
      (*this->_vptr_Deserializer[2])(this,0,"first");
      (*this->_vptr_Deserializer[0x19])(this);
      (*this->_vptr_Deserializer[3])(this);
      (*this->_vptr_Deserializer[2])(this,1,"second");
      iVar1 = (*this->_vptr_Deserializer[0x15])(this);
      (*this->_vptr_Deserializer[3])(this);
      (*this->_vptr_Deserializer[7])(this);
      local_40.second = CONCAT44(extraout_var_00,iVar1);
      ::std::
      priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>
      ::emplace<std::pair<double,unsigned_long>>
                ((priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>
                  *)__return_storage_ptr__,&local_40);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_queue<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_queue<T>::ELEMENT_TYPE;
		T queue;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			queue.emplace(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return queue;
	}